

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix44<float>::Matrix44(Matrix44<float> *this)

{
  Matrix44<float> *this_local;
  
  this->x[0][0] = 1.0;
  this->x[0][1] = 0.0;
  this->x[0][2] = 0.0;
  this->x[0][3] = 0.0;
  this->x[1][0] = 0.0;
  this->x[1][1] = 1.0;
  this->x[1][2] = 0.0;
  this->x[1][3] = 0.0;
  this->x[2][0] = 0.0;
  this->x[2][1] = 0.0;
  this->x[2][2] = 1.0;
  this->x[2][3] = 0.0;
  this->x[3][0] = 0.0;
  this->x[3][1] = 0.0;
  this->x[3][2] = 0.0;
  this->x[3][3] = 1.0;
  return;
}

Assistant:

IMATH_HOSTDEVICE
    IMATH_CONSTEXPR14 inline Matrix44<T>::Matrix44 () IMATH_NOEXCEPT
{
    x[0][0] = 1;
    x[0][1] = 0;
    x[0][2] = 0;
    x[0][3] = 0;
    x[1][0] = 0;
    x[1][1] = 1;
    x[1][2] = 0;
    x[1][3] = 0;
    x[2][0] = 0;
    x[2][1] = 0;
    x[2][2] = 1;
    x[2][3] = 0;
    x[3][0] = 0;
    x[3][1] = 0;
    x[3][2] = 0;
    x[3][3] = 1;
}